

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

Str32 tl::toUtf32(CStr o)

{
  u32 size;
  char32_t cVar1;
  char32_t *pcVar2;
  undefined8 in_RDX;
  char *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined8 extraout_RDX_02;
  u32 i;
  uint i_00;
  StrT<char32_t> *this;
  CStr o_00;
  Str32 SVar4;
  char *c;
  char *local_30;
  
  this = o._0_8_;
  StrT<char32_t>::StrT(this);
  o_00._str = extraout_RDX;
  o_00._0_8_ = in_RDX;
  size = calcSizeUtf32((tl *)((ulong)o._str & 0xffffffff),o_00);
  uVar3 = extraout_RDX_00;
  if (1 < size + 1) {
    StrT<char32_t>::resizeNoCopy(this,size);
    cVar1 = getUtf32TokenAndAdvance(&local_30);
    uVar3 = extraout_RDX_01;
    for (i_00 = 0; (cVar1 != L'\xffffffff' && (i_00 < size)); i_00 = i_00 + 1) {
      pcVar2 = StrT<char32_t>::operator[](this,i_00);
      *pcVar2 = cVar1;
      cVar1 = getUtf32TokenAndAdvance(&local_30);
      uVar3 = extraout_RDX_02;
    }
  }
  SVar4._8_8_ = uVar3;
  SVar4._str = (char32_t *)this;
  return SVar4;
}

Assistant:

Str32 toUtf32(CStr o)
{
    Str32 res;
    const u32 size = calcSizeUtf32(o);
    if(size == 0 || size == TOKEN_ERROR)
        return res;
    res.resizeNoCopy(size);
    const char* c = o.c_str();
    char32_t token = getUtf32TokenAndAdvance(c);
    for(u32 i = 0; i < size && token != TOKEN_ERROR; i++) {
        res[i] = token;
        token = getUtf32TokenAndAdvance(c);
    }
    return res;
}